

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

void linearize_assignment(Proc *proc,AstNodeList *expr_list,node_info *varinfo,int nv)

{
  uint line_number;
  ravitype_t rVar1;
  uint *puVar2;
  C_MemoryAllocator *pCVar3;
  void *pvVar4;
  _func_void_ptr_void_ptr_size_t_size_t *p_Var5;
  VariableType *pVVar6;
  VariableType *pVVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  AstNode *expr;
  Pseudo *pPVar12;
  Pseudo *pPVar13;
  Pseudo *pPVar14;
  char *ptr;
  BasicBlock *pBVar15;
  ulong uVar16;
  undefined8 *puVar17;
  ulong uVar18;
  ravitype_t type;
  char cVar19;
  long lVar20;
  Pseudo **ppPVar21;
  int iVar22;
  undefined8 auStack_c8 [3];
  undefined1 local_b0 [8];
  PtrListIterator expriter__;
  Pseudo *local_70;
  
  auStack_c8[1] = 0x11bf4f;
  iVar9 = raviX_ptrlist_size((PtrList *)expr_list);
  lVar11 = (long)iVar9;
  lVar8 = lVar11 * -0x10;
  auStack_c8[lVar11 * -2 + 1] = 0x11bf7c;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_b0,(PtrList *)expr_list);
  auStack_c8[lVar11 * -2 + 1] = 0x11bf84;
  expr = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_b0);
  if (expr == (AstNode *)0x0) {
    line_number = 0;
    local_70 = (Pseudo *)0x0;
  }
  else {
    puVar17 = (undefined8 *)(local_b0 + lVar8);
    iVar22 = 1;
    line_number = 0;
    do {
      if (line_number == 0) {
        line_number = expr->line_number;
      }
      auStack_c8[lVar11 * -2 + 1] = 0x11bfc0;
      local_70 = linearize_expression(proc,expr);
      uVar10 = *(uint *)local_70;
      pPVar12 = local_70;
      if ((uVar10 & 0xf) == 0xe) {
        auStack_c8[lVar11 * -2 + 1] = 0x11bfe0;
        pPVar12 = indexed_load(proc,local_70);
        uVar10 = *(uint *)pPVar12;
      }
      puVar17[-1] = &expr->field_2;
      pPVar13 = pPVar12;
      if ((uVar10 & 0xf) == 0) {
        type = RAVI_TANY;
        if ((((pPVar12->field_3).symbol)->symbol_type < SYM_GLOBAL) &&
           (rVar1 = (((pPVar12->field_3).symbol)->field_1).variable.value_type.type_code,
           type = -(uint)(rVar1 != RAVI_TNUMFLT) | RAVI_TNUMFLT, rVar1 == RAVI_TNUMINT)) {
          type = RAVI_TNUMINT;
        }
        uVar10 = expr->line_number;
        auStack_c8[lVar11 * -2 + 1] = 0x11c031;
        pPVar13 = allocate_temp_pseudo(proc,type,true);
        auStack_c8[lVar11 * -2 + 1] = 0x11c04b;
        instruct_move(proc,op_mov,pPVar13,pPVar12,uVar10);
      }
      *puVar17 = pPVar13;
      if ((iVar22 < iVar9) && ((*(uint *)pPVar12 & 0xf) == 0xb)) {
        if ((pPVar12->field_3).range_in_use != 0) {
          auStack_c8[lVar11 * -2 + 1] = 0x11c463;
          __assert_fail("pseudo->range_in_use == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0x24a,"Pseudo *convert_range_to_temp(Pseudo *)");
        }
        *(uint *)pPVar12 = *(uint *)pPVar12 & 0xfffffff0 | 4;
      }
      auStack_c8[lVar11 * -2 + 1] = 0x11c081;
      expr = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_b0);
      puVar17 = puVar17 + 2;
      iVar22 = iVar22 + 1;
    } while (expr != (AstNode *)0x0);
  }
  uVar16 = (ulong)(uint)nv;
  if (0 < nv) {
    lVar20 = 8;
    uVar18 = 0;
    expriter__._16_8_ = ZEXT48(iVar9 - 1);
    do {
      if ((long)uVar18 < lVar11) {
        pPVar12 = *(Pseudo **)(local_b0 + lVar20 + lVar8 + -0xb8 + 0xb0);
        if (((undefined1  [48])*pPVar12 & (undefined1  [48])0xf) == (undefined1  [48])0xb) {
          if (expriter__._16_8_ != uVar18) {
            auStack_c8[lVar11 * -2 + 1] = linearize_store_var;
            __assert_fail("i == note_ne-1",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                          ,0x738,
                          "void linearize_assignment(Proc *, AstNodeList *, struct node_info *, int)"
                         );
          }
          auStack_c8[lVar11 * -2 + 1] = 0x11c129;
          pPVar14 = raviX_allocate_range_select_pseudo(proc,pPVar12,0);
          *(Pseudo **)(local_b0 + lVar20 + lVar8 + -0xb8 + 0xb0) = pPVar14;
          pPVar13 = pPVar12;
          pPVar12 = pPVar14;
        }
        else {
          pPVar13 = (Pseudo *)0x0;
        }
        pVVar6 = *(VariableType **)((long)auStack_c8 + lVar20 + lVar8 + 8);
        pVVar7 = *(VariableType **)((long)varinfo + lVar20 + -8);
        pPVar14 = *(Pseudo **)((long)&varinfo->vartype + lVar20);
        auStack_c8[lVar11 * -2 + 1] = 0x11c29a;
        linearize_store_var(proc,pVVar7,pPVar14,pVVar6,pPVar12,line_number);
        auStack_c8[lVar11 * -2 + 1] = 0x11c2a7;
        free_temp_pseudo(proc,pPVar12,false);
        if (pPVar13 != (Pseudo *)0x0) {
LAB_0011c2b4:
          auStack_c8[lVar11 * -2 + 1] = 0x11c2c1;
          free_temp_pseudo(proc,pPVar13,false);
        }
      }
      else {
        if ((local_70 != (Pseudo *)0x0) &&
           (((undefined1  [48])*local_70 & (undefined1  [48])0xf) == (undefined1  [48])0xb)) {
          auStack_c8[lVar11 * -2 + 1] = 0x11c15b;
          pPVar13 = raviX_allocate_range_select_pseudo(proc,local_70,(1 - iVar9) + (int)uVar18);
          pVVar6 = *(VariableType **)((long)varinfo + lVar20 + -8);
          pPVar12 = *(Pseudo **)((long)&varinfo->vartype + lVar20);
          pVVar7 = (VariableType *)auStack_c8[0];
          auStack_c8[lVar11 * -2 + 1] = 0x11c185;
          linearize_store_var(proc,pVVar6,pPVar12,pVVar7,pPVar13,line_number);
          goto LAB_0011c2b4;
        }
        iVar22 = **(int **)((long)varinfo + lVar20 + -8);
        if (((iVar22 == 0x20) || (iVar22 == 0x80)) || (iVar22 == 0x40)) {
          cVar19 = (iVar22 == 0x40) * '\x02' + ';';
          puVar2 = *(uint **)((long)&varinfo->vartype + lVar20);
          pCVar3 = proc->linearizer->compiler_state->allocator;
          pvVar4 = pCVar3->arena;
          p_Var5 = pCVar3->calloc;
          auStack_c8[lVar11 * -2 + 1] = 0x11c1e4;
          ptr = (char *)(*p_Var5)(pvVar4,1,0x28);
          if (iVar22 == 0x20) {
            cVar19 = '<';
          }
          *ptr = cVar19;
          *(uint *)(ptr + 0x20) = line_number;
          if ((*puVar2 & 0xf) == 0xe) goto LAB_0011c406;
          pCVar3 = proc->linearizer->compiler_state->allocator;
          auStack_c8[lVar11 * -2 + 1] = 0x11c22f;
          raviX_ptrlist_add((PtrList **)(ptr + 0x10),puVar2,pCVar3);
          pBVar15 = proc->current_bb;
          if (*(BasicBlock **)(ptr + 0x18) != pBVar15 &&
              *(BasicBlock **)(ptr + 0x18) != (BasicBlock *)0x0) goto LAB_0011c425;
          pCVar3 = proc->linearizer->compiler_state->allocator;
          auStack_c8[lVar11 * -2 + 1] = 0x11c266;
          raviX_ptrlist_add((PtrList **)&pBVar15->insns,ptr,pCVar3);
          pBVar15 = proc->current_bb;
        }
        else {
          puVar2 = *(uint **)((long)&varinfo->vartype + lVar20);
          pCVar3 = proc->linearizer->compiler_state->allocator;
          pvVar4 = pCVar3->arena;
          p_Var5 = pCVar3->calloc;
          auStack_c8[lVar11 * -2 + 1] = 0x11c2ec;
          ptr = (char *)(*p_Var5)(pvVar4,1,0x28);
          *ptr = ']';
          *(uint *)(ptr + 0x20) = line_number;
          if ((*puVar2 & 0xf) == 0xe) {
LAB_0011c406:
            auStack_c8[lVar11 * -2 + 1] = 0x11c425;
            __assert_fail("pseudo->type != PSEUDO_INDEXED",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                          ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
          }
          pCVar3 = proc->linearizer->compiler_state->allocator;
          auStack_c8[lVar11 * -2 + 1] = 0x11c324;
          raviX_ptrlist_add((PtrList **)(ptr + 0x10),puVar2,pCVar3);
          pBVar15 = proc->current_bb;
          if (*(BasicBlock **)(ptr + 0x18) != pBVar15 &&
              *(BasicBlock **)(ptr + 0x18) != (BasicBlock *)0x0) {
LAB_0011c425:
            auStack_c8[lVar11 * -2 + 1] = 0x11c444;
            __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                          ,0x1b1,"void add_instruction(Proc *, Instruction *)");
          }
          pCVar3 = proc->linearizer->compiler_state->allocator;
          auStack_c8[lVar11 * -2 + 1] = 0x11c357;
          raviX_ptrlist_add((PtrList **)&pBVar15->insns,ptr,pCVar3);
          pBVar15 = proc->current_bb;
        }
        *(BasicBlock **)(ptr + 0x18) = pBVar15;
      }
      uVar18 = uVar18 + 1;
      lVar20 = lVar20 + 0x10;
    } while (uVar16 != uVar18);
  }
  if (0 < iVar9) {
    uVar18 = lVar11 + 1;
    puVar17 = auStack_c8 + 1;
    do {
      pPVar12 = (Pseudo *)*puVar17;
      auStack_c8[lVar11 * -2 + 1] = 0x11c398;
      free_temp_pseudo(proc,pPVar12,false);
      uVar18 = uVar18 - 1;
      puVar17 = puVar17 + -2;
    } while (1 < uVar18);
  }
  if (0 < nv) {
    uVar18 = uVar16 + 1;
    ppPVar21 = &varinfo[uVar16 - 1].pseudo;
    do {
      pPVar12 = *ppPVar21;
      auStack_c8[lVar11 * -2 + 1] = 0x11c3cd;
      free_temp_pseudo(proc,pPVar12,false);
      uVar18 = uVar18 - 1;
      ppPVar21 = ppPVar21 + -2;
    } while (1 < uVar18);
  }
  if ((local_70 != (Pseudo *)0x0) &&
     (((undefined1  [48])*local_70 & (undefined1  [48])0xf) == (undefined1  [48])0xb)) {
    auStack_c8[lVar11 * -2 + 1] = 0x11c3f7;
    free_temp_pseudo(proc,local_70,false);
  }
  return;
}

Assistant:

static void linearize_assignment(Proc *proc, AstNodeList *expr_list, struct node_info *varinfo, int nv)
{
	AstNode *expr;

	// Process RHS expressions
	int ne = raviX_ptrlist_size((const PtrList *)expr_list);
	struct node_info *valinfo = (struct node_info *)alloca(ne * sizeof(struct node_info));
	Pseudo *last_val_pseudo = NULL;
	int i = 0;
	unsigned line_number = 0;
	FOR_EACH_PTR(expr_list, AstNode, expr)
	{
		line_number = line_number == 0 ? expr->line_number : line_number;
		Pseudo *val_pseudo = last_val_pseudo = linearize_expression(proc, expr);
		if (val_pseudo->type == PSEUDO_INDEXED)
			val_pseudo = indexed_load(proc, val_pseudo);
		valinfo[i].vartype = &expr->common_expr.type;
		// To support the Lua semantics of x,y = y,x as a swap
		// we need to copy locals to temps
		// TODO can this be optimized to only do when needed
		// See also check_conflict() in Lua parser
		valinfo[i].pseudo = copy_to_temp_if_necessary(proc, val_pseudo, expr->line_number);
		i++;
		if (i < ne && val_pseudo->type == PSEUDO_RANGE) {
			convert_range_to_temp(val_pseudo);
		}
	}
	END_FOR_EACH_PTR(expr)

	/* TODO do we need to insert type assertions in some cases such as function return values ? */

	int note_ne = ne;
	// nv = number of variables (LHS)
	// ne = number of expressions (RHS)
	for (i = 0; i < nv; i++) {
		if (i >= ne) {
			// Went past ne
			if (last_val_pseudo != NULL && last_val_pseudo->type == PSEUDO_RANGE) {
				int pick = i - ne + 1;
				Pseudo *range_select_pseudo = raviX_allocate_range_select_pseudo(proc, last_val_pseudo, pick);
				linearize_store_var(proc, varinfo[i].vartype, varinfo[i].pseudo,
						    valinfo[ne-1].vartype,
				    range_select_pseudo, line_number);
				free_temp_pseudo(proc, range_select_pseudo, false);
			} else {
				if (varinfo[i].vartype->type_code == RAVI_TTABLE ||
				    varinfo[i].vartype->type_code == RAVI_TARRAYFLT ||
				    varinfo[i].vartype->type_code == RAVI_TARRAYINT) {
					linearize_table_constructor_inplace(proc, varinfo[i].pseudo, varinfo[i].vartype->type_code, line_number);
				}
				else {
					linearize_init(proc, varinfo[i].pseudo, line_number);
				}
			}
		}
		else {
			Pseudo *range_pseudo = NULL;
			if (valinfo[i].pseudo->type == PSEUDO_RANGE) {
				/* Only the topmost expression can be a range ... assert */
				assert(i == note_ne-1);
				range_pseudo = valinfo[i].pseudo;
				valinfo[i].pseudo = raviX_allocate_range_select_pseudo(proc, valinfo[i].pseudo, 0);
			}
			linearize_store_var(proc, varinfo[i].vartype, varinfo[i].pseudo,
					    valinfo[i].vartype, valinfo[i].pseudo, line_number);
			free_temp_pseudo(proc, valinfo[i].pseudo, false);
			if (range_pseudo) {
				free_temp_pseudo(proc, range_pseudo, false);
			}
		}
	}

	for (int i = ne-1; i >= 0; i--) {
		free_temp_pseudo(proc, valinfo[i].pseudo, false);
	}
	for (int i = nv-1; i >= 0; i--) {
		free_temp_pseudo(proc, varinfo[i].pseudo, false);
	}
	if (last_val_pseudo != NULL && last_val_pseudo->type == PSEUDO_RANGE) {
		free_temp_pseudo(proc, last_val_pseudo, false);
	}
	return;
}